

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

void __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>,std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>,std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>>>>>>
::
emplace_at<std::piecewise_construct_t_const&,std::tuple<google::protobuf::FieldDescriptor_const*const&>,std::tuple<>>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>,std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>,std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>>>>>>
           *this,iterator iter,piecewise_construct_t *args,
          tuple<const_google::protobuf::FieldDescriptor_*const_&> *args_1,tuple<> *args_2)

{
  bool bVar1;
  reference args_00;
  FindElement local_50;
  iterator local_48;
  iterator local_38;
  iterator local_28;
  
  local_38.field_1 = iter.field_1;
  local_38.ctrl_ = iter.ctrl_;
  construct<std::piecewise_construct_t_const&,std::tuple<google::protobuf::FieldDescriptor_const*const&>,std::tuple<>>
            (this,local_38.field_1.slot_,args,args_1,args_2);
  local_50.s = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>_>_>
                *)this;
  args_00 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>_>_>
            ::iterator::operator*(&local_38);
  local_28 = (iterator)
             DecomposePair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>,std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>,std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>>>>>>::FindElement,std::pair<google::protobuf::FieldDescriptor_const*const,std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>,std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>>>>&>
                       (&local_50,args_00);
  local_48.ctrl_ = local_38.ctrl_;
  local_48.field_1.slot_ = (slot_type *)local_38.field_1;
  bVar1 = container_internal::operator==(&local_28,&local_48);
  if (bVar1) {
    return;
  }
  __assert_fail("PolicyTraits::apply(FindElement{*this}, *iter) == iter && \"constructed value does not match the lookup key\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xfe2,
                "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::FieldDescriptor *, std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree>>>, absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Eq, std::allocator<std::pair<const google::protobuf::FieldDescriptor *const, std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree>>>>>::emplace_at(iterator, Args &&...) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::FieldDescriptor *, std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree>>>, Hash = absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::FieldDescriptor *const, std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree>>>>, Args = <const std::piecewise_construct_t &, std::tuple<const google::protobuf::FieldDescriptor *const &>, std::tuple<>>]"
               );
}

Assistant:

void emplace_at(iterator iter, Args&&... args) {
    construct(iter.slot(), std::forward<Args>(args)...);

    assert(PolicyTraits::apply(FindElement{*this}, *iter) == iter &&
           "constructed value does not match the lookup key");
  }